

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableBeginCell(ImGuiTable *table,int column_n)

{
  ImVec4 *pIVar1;
  float fVar2;
  bool bVar3;
  ImGuiTableColumn *pIVar4;
  ImGuiWindow *pIVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImDrawList *pIVar10;
  ImDrawListSplitter *this;
  uint uVar11;
  float fVar12;
  float fVar13;
  
  pIVar4 = (table->Columns).Data;
  pIVar5 = table->InnerWindow;
  table->CurrentColumn = column_n;
  fVar2 = pIVar4[column_n].WorkMinX;
  fVar13 = fVar2;
  if ((pIVar4[column_n].Flags & 0x10000) != 0) {
    fVar13 = table->RowIndentOffsetX + fVar2;
  }
  (pIVar5->DC).CursorPos.x = fVar13;
  fVar12 = table->RowPosY1 + table->CellPaddingY;
  (pIVar5->DC).CursorPos.y = fVar12;
  (pIVar5->DC).CursorMaxPos.x = fVar13;
  (pIVar5->DC).ColumnsOffset.x = (fVar13 - (pIVar5->Pos).x) - (pIVar5->DC).Indent.x;
  (pIVar5->DC).CurrLineTextBaseOffset = table->RowTextBaseline;
  (pIVar5->DC).NavLayerCurrent = (int)pIVar4[column_n].NavLayerCurrent;
  (pIVar5->WorkRect).Min.y = fVar12;
  (pIVar5->WorkRect).Min.x = fVar2;
  (pIVar5->WorkRect).Max.x = pIVar4[column_n].WorkMaxX;
  (pIVar5->DC).ItemWidth = pIVar4[column_n].ItemWidth;
  if (pIVar4[column_n].IsEnabled == false) {
    uVar11 = -(uint)(table->RowPosY2 <= fVar12);
    (pIVar5->DC).CursorPos.y = (float)(~uVar11 & (uint)table->RowPosY2 | (uint)fVar12 & uVar11);
  }
  bVar3 = pIVar4[column_n].IsSkipItems;
  pIVar5->SkipItems = bVar3;
  pIVar9 = GImGui;
  if (bVar3 == true) {
    (GImGui->LastItemData).ID = 0;
    (pIVar9->LastItemData).StatusFlags = 0;
  }
  if ((table->Flags & 0x100000) == 0) {
    IVar6 = pIVar4[column_n].ClipRect.Min;
    IVar7 = pIVar4[column_n].ClipRect.Max;
    IVar8 = pIVar4[column_n].ClipRect.Max;
    (pIVar5->ClipRect).Min = pIVar4[column_n].ClipRect.Min;
    (pIVar5->ClipRect).Max = IVar8;
    pIVar10 = pIVar5->DrawList;
    (pIVar10->_CmdHeader).ClipRect.x = IVar6.x;
    (pIVar10->_CmdHeader).ClipRect.y = IVar6.y;
    (pIVar10->_CmdHeader).ClipRect.z = IVar7.x;
    (pIVar10->_CmdHeader).ClipRect.w = IVar7.y;
    pIVar1 = (pIVar5->DrawList->_ClipRectStack).Data +
             (long)(pIVar5->DrawList->_ClipRectStack).Size + -1;
    pIVar1->x = IVar6.x;
    pIVar1->y = IVar6.y;
    pIVar1->z = IVar7.x;
    pIVar1->w = IVar7.y;
    this = table->DrawSplitter;
    pIVar10 = pIVar5->DrawList;
    uVar11 = (uint)pIVar4[column_n].DrawChannelCurrent;
  }
  else {
    this = table->DrawSplitter;
    pIVar10 = pIVar5->DrawList;
    uVar11 = 2;
  }
  ImDrawListSplitter::SetCurrentChannel(this,pIVar10,uVar11);
  pIVar9 = GImGui;
  if ((GImGui->LogEnabled == true) && (pIVar4[column_n].IsSkipItems == false)) {
    LogRenderedText(&(pIVar5->DC).CursorPos,"|",(char *)0x0);
    pIVar9->LogLinePosY = 3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::TableBeginApplyRequests(ImGuiTable* table)
{
    // Handle resizing request
    // (We process this at the first TableBegin of the frame)
    // FIXME-TABLE: Contains columns if our work area doesn't allow for scrolling?
    if (table->InstanceCurrent == 0)
    {
        if (table->ResizedColumn != -1 && table->ResizedColumnNextWidth != FLT_MAX)
            TableSetColumnWidth(table->ResizedColumn, table->ResizedColumnNextWidth);
        table->LastResizedColumn = table->ResizedColumn;
        table->ResizedColumnNextWidth = FLT_MAX;
        table->ResizedColumn = -1;

        // Process auto-fit for single column, which is a special case for stretch columns and fixed columns with FixedSame policy.
        // FIXME-TABLE: Would be nice to redistribute available stretch space accordingly to other weights, instead of giving it all to siblings.
        if (table->AutoFitSingleColumn != -1)
        {
            TableSetColumnWidth(table->AutoFitSingleColumn, table->Columns[table->AutoFitSingleColumn].WidthAuto);
            table->AutoFitSingleColumn = -1;
        }
    }

    // Handle reordering request
    // Note: we don't clear ReorderColumn after handling the request.
    if (table->InstanceCurrent == 0)
    {
        if (table->HeldHeaderColumn == -1 && table->ReorderColumn != -1)
            table->ReorderColumn = -1;
        table->HeldHeaderColumn = -1;
        if (table->ReorderColumn != -1 && table->ReorderColumnDir != 0)
        {
            // We need to handle reordering across hidden columns.
            // In the configuration below, moving C to the right of E will lead to:
            //    ... C [D] E  --->  ... [D] E  C   (Column name/index)
            //    ... 2  3  4        ...  2  3  4   (Display order)
            const int reorder_dir = table->ReorderColumnDir;
            IM_ASSERT(reorder_dir == -1 || reorder_dir == +1);
            IM_ASSERT(table->Flags & ImGuiTableFlags_Reorderable);
            ImGuiTableColumn* src_column = &table->Columns[table->ReorderColumn];
            ImGuiTableColumn* dst_column = &table->Columns[(reorder_dir == -1) ? src_column->PrevEnabledColumn : src_column->NextEnabledColumn];
            IM_UNUSED(dst_column);
            const int src_order = src_column->DisplayOrder;
            const int dst_order = dst_column->DisplayOrder;
            src_column->DisplayOrder = (ImGuiTableColumnIdx)dst_order;
            for (int order_n = src_order + reorder_dir; order_n != dst_order + reorder_dir; order_n += reorder_dir)
                table->Columns[table->DisplayOrderToIndex[order_n]].DisplayOrder -= (ImGuiTableColumnIdx)reorder_dir;
            IM_ASSERT(dst_column->DisplayOrder == dst_order - reorder_dir);

            // Display order is stored in both columns->IndexDisplayOrder and table->DisplayOrder[],
            // rebuild the later from the former.
            for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
            table->ReorderColumnDir = 0;
            table->IsSettingsDirty = true;
        }
    }

    // Handle display order reset request
    if (table->IsResetDisplayOrderRequest)
    {
        for (int n = 0; n < table->ColumnsCount; n++)
            table->DisplayOrderToIndex[n] = table->Columns[n].DisplayOrder = (ImGuiTableColumnIdx)n;
        table->IsResetDisplayOrderRequest = false;
        table->IsSettingsDirty = true;
    }
}